

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::CheckTypeAndMergeFrom
          (ItemSimilarityRecommender *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  StringVector *pSVar2;
  Int64Vector *pIVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__ItemSimilarityRecommender_004be018) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::ItemSimilarityRecommender *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((ItemSimilarityRecommender *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/ItemSimilarityRecommender.pb.cc"
               ,0x40b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             (RepeatedPtrFieldBase *)(from + 1));
  uVar5 = from[2]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->iteminputfeaturename_,uVar5,puVar4);
  }
  uVar5 = (ulong)from[3]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->numrecommendationsinputfeaturename_,uVar5,puVar4);
  }
  uVar5 = from[3]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemrestrictioninputfeaturename_,uVar5,puVar4);
  }
  uVar5 = (ulong)from[4]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemexclusioninputfeaturename_,uVar5,puVar4);
  }
  uVar5 = from[4]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemlistoutputfeaturename_,uVar5,puVar4);
  }
  uVar5 = (ulong)from[5]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemscoreoutputfeaturename_,uVar5,puVar4);
  }
  if ((from != (MessageLite *)_ItemSimilarityRecommender_default_instance_) &&
     (from[5]._internal_metadata_.ptr_ != 0)) {
    if (this->itemstringids_ == (StringVector *)0x0) {
      uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pSVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                         (pAVar7);
      this->itemstringids_ = pSVar2;
    }
    puVar6 = (undefined1 *)from[5]._internal_metadata_.ptr_;
    if ((StringVector *)puVar6 == (StringVector *)0x0) {
      puVar6 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this->itemstringids_,(StringVector *)puVar6);
  }
  if ((from != (MessageLite *)_ItemSimilarityRecommender_default_instance_) &&
     (from[6]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->itemint64ids_ == (Int64Vector *)0x0) {
      uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pIVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                         (pAVar7);
      this->itemint64ids_ = pIVar3;
    }
    puVar6 = (undefined1 *)from[6]._vptr_MessageLite;
    if ((Int64Vector *)puVar6 == (Int64Vector *)0x0) {
      puVar6 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this->itemint64ids_,(Int64Vector *)puVar6);
  }
  uVar5 = (from->_internal_metadata_).ptr_;
  if ((uVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar5 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}